

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O0

TestStatus *
vkt::synchronization::anon_unknown_0::deviceWaitForEventCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)6>_> data;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  RefData<vk::Handle<(vk::HandleType)10>_> data_02;
  VkResult result;
  int iVar2;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue pVVar3;
  Handle<(vk::HandleType)24> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)10> *pHVar6;
  Handle<(vk::HandleType)6> *pHVar7;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  deUint64 local_270;
  undefined4 local_268;
  allocator<char> local_261;
  string local_260;
  deUint64 local_240;
  Move<vk::Handle<(vk::HandleType)10>_> local_238;
  RefData<vk::Handle<(vk::HandleType)10>_> local_218;
  undefined1 local_1f8 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkEventCreateInfo eventInfo;
  undefined8 uStack_1b8;
  VkSubmitInfo submitInfo;
  Move<vk::VkCommandBuffer_s_*> local_168;
  RefData<vk::VkCommandBuffer_s_*> local_148;
  undefined1 local_128 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_e8;
  undefined1 local_c8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)6>_> local_98;
  RefData<vk::Handle<(vk::HandleType)6>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  pVVar3 = Context::getUniversalQueue(context);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_ =
       Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence(&local_98,vk_00,device_00,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device._0_4_ = (int)local_78.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_78.deleter.m_device >> 0x20);
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_98);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,device_00
             ,2,fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_
             ,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_e8,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object.m_internal = local_e8.object.m_internal;
  data_00.deleter.m_device._0_4_ = (int)local_e8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_e8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator = local_e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_c8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  submitInfo.pSignalSemaphores = (VkSemaphore *)pHVar4->m_internal;
  makeCommandBuffer(&local_168,vk_00,device_00,(VkCommandPool)submitInfo.pSignalSemaphores);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_148,(Move *)&local_168);
  data_01.deleter.m_deviceIface = local_148.deleter.m_deviceIface;
  data_01.object = local_148.object;
  data_01.deleter.m_device._0_4_ = (int)local_148.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_148.deleter.m_device >> 0x20);
  data_01.deleter.m_pool.m_internal = local_148.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_128,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_168);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_1b8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_128);
  event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0xa;
  ::vk::createEvent(&local_238,vk_00,device_00,
                    (VkEventCreateInfo *)
                    &event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator
                    ,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_218,(Move *)&local_238);
  data_02.deleter.m_deviceIface = local_218.deleter.m_deviceIface;
  data_02.object.m_internal = local_218.object.m_internal;
  data_02.deleter.m_device._0_4_ = (int)local_218.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_218.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator = local_218.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_1f8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move(&local_238);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_128);
  beginCommandBuffer(vk_00,*ppVVar5);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_128);
  pVVar1 = *ppVVar5;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_1f8);
  (*vk_00->_vptr_DeviceInterface[0x6c])(vk_00,pVVar1,1,pHVar6,0x4000,0x10000,0,0,0,0,0,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_128);
  endCommandBuffer(vk_00,*ppVVar5);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_58);
  local_240 = pHVar7->m_internal;
  result = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&uStack_1b8,local_240);
  ::vk::checkResult(result,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x9e);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_58);
  iVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device_00,1,pHVar7,1,1000);
  if (iVar2 == 2) {
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_1f8);
    local_270 = pHVar6->m_internal;
    iVar2 = (*vk_00->_vptr_DeviceInterface[0x1c])(vk_00,device_00,local_270);
    if (iVar2 == 0) {
      pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                         ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_58);
      iVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device_00,1,pHVar7,1,0xffffffffffffffff);
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2e0,"Device wait for event tests pass",&local_2e1);
        tcu::TestStatus::pass(__return_storage_ptr__,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,"Queue should end execution",&local_2b9);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator(&local_2b9);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"Couldn\'t set event",&local_291);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator(&local_291);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Queue should not end execution",&local_261);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
  }
  local_268 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_1f8);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_128);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus deviceWaitForEventCase (Context& context)
{
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>			fence				(createFence(vk, device));
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
															DE_NULL,						// const void*					pNext;
															0u,								// deUint32						waitSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
															DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
															1u,								// deUint32						commandBufferCount;
															&cmdBuffer.get(),				// const VkCommandBuffer*		pCommandBuffers;
															0u,								// deUint32						signalSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
														};
	const VkEventCreateInfo			eventInfo			=
														{
															VK_STRUCTURE_TYPE_EVENT_CREATE_INFO,
															DE_NULL,
															0
														};
	const Unique<VkEvent>			event				(createEvent(vk, device, &eventInfo, DE_NULL));

	beginCommandBuffer(vk, *cmdBuffer);
	vk.cmdWaitEvents(*cmdBuffer, 1u, &event.get(), VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, *cmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_TIMEOUT != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, SHORT_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should not end execution");

	if (VK_SUCCESS != vk.setEvent(device, *event))
		return tcu::TestStatus::fail("Couldn't set event");

	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Device wait for event tests pass");
}